

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O2

shared_ptr<const_CBlock> __thiscall
validation_block_tests::MinerTestingSetup::BadBlock(MinerTestingSetup *this,uint256 *prev_hash)

{
  element_type *peVar1;
  TestingSetup *pTVar2;
  undefined8 uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<CBlock> pblock_00;
  shared_ptr<const_CBlock> sVar4;
  CMutableTransaction coinbase_spend;
  shared_ptr<CBlock> pblock;
  shared_ptr<CBlock> ret;
  CTransactionRef tx;
  __shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2> _Stack_c8;
  int local_b4;
  CMutableTransaction local_b0;
  undefined1 local_78 [16];
  undefined1 local_68 [24];
  __uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> _Stack_50;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  __uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> local_38;
  __uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> _Stack_30;
  uint32_t local_28;
  _Head_base<0UL,_PeerManager_*,_false> local_20;
  
  local_20._M_head_impl =
       *(PeerManager **)
        &((__uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_> *)(in_FS_OFFSET + 0x28))
         ->_M_t;
  Block((MinerTestingSetup *)local_78,prev_hash);
  CMutableTransaction::CMutableTransaction(&local_b0);
  peVar1 = (((((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)(local_78._0_8_ + 0x50))->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48 = *(undefined1 (*) [8])&(peVar1->hash).m_wrapped;
  _Stack_40._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&peVar1->hash + 8);
  local_38._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
       *(tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_> *)((long)&peVar1->hash + 0x10);
  _Stack_30._M_t.
  super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>.
  super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl =
       *(tuple<const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_> *)
        ((long)&peVar1->hash + 0x18);
  local_28 = 0;
  local_68._16_8_ = (Init *)0x0;
  _Stack_50._M_t.super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
  super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl =
       (tuple<ECC_Context_*,_std::default_delete<ECC_Context>_>)
       (_Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>)0x0;
  local_68._0_8_ = (__uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>)0x0;
  local_68._8_8_ = (__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>)0x0;
  local_b4 = 0;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint,CScript,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&local_b0,(COutPoint *)local_48,
             (CScript *)local_68,&local_b4);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_68);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
            (&local_b0.vout,
             *(value_type **)
              &(((((((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)(local_78._0_8_ + 0x50))->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->vout).
               super__Vector_base<CTxOut,_std::allocator<CTxOut>_>);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_48);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)(local_78._0_8_ + 0x50),(value_type *)local_48);
  std::__shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_c8,(__shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2> *)local_78);
  pblock_00.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&_Stack_c8;
  pblock_00.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)prev_hash;
  FinalizeBlock((MinerTestingSetup *)local_68,pblock_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_c8._M_refcount);
  uVar3 = local_68._8_8_;
  local_68._8_8_ = (__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>)0x0;
  pTVar2 = &(this->super_RegTestingSetup).super_TestingSetup;
  (pTVar2->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.m_flag =
       (atomic<bool>)local_68[0];
  *(undefined3 *)&(pTVar2->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.field_0x1 =
       local_68._1_3_;
  (pTVar2->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.m_pipe_r =
       (TokenPipeEnd)local_68._4_4_;
  *(undefined8 *)
   &(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup
    .m_interrupt.m_pipe_w = uVar3;
  local_68._0_8_ = (__uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  CMutableTransaction::~CMutableTransaction(&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  if (((_Head_base<0UL,_PeerManager_*,_false> *)(in_FS_OFFSET + 0x28))->_M_head_impl ==
      local_20._M_head_impl) {
    sVar4.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar4.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
    ;
    return (shared_ptr<const_CBlock>)
           sVar4.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<const CBlock> MinerTestingSetup::BadBlock(const uint256& prev_hash)
{
    auto pblock = Block(prev_hash);

    CMutableTransaction coinbase_spend;
    coinbase_spend.vin.emplace_back(COutPoint(pblock->vtx[0]->GetHash(), 0), CScript(), 0);
    coinbase_spend.vout.push_back(pblock->vtx[0]->vout[0]);

    CTransactionRef tx = MakeTransactionRef(coinbase_spend);
    pblock->vtx.push_back(tx);

    auto ret = FinalizeBlock(pblock);
    return ret;
}